

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setPartials
          (BeagleCPUImpl<float,_1,_0> *this,int bufferIndex,double *inPartials)

{
  double *pdVar1;
  undefined1 auVar2 [64];
  int iVar3;
  uint uVar4;
  int iVar5;
  float **ppfVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  ulong uVar15;
  int iVar16;
  float *pfVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  float *pfVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  
  iVar16 = -5;
  if ((-1 < bufferIndex) && (iVar16 = -5, bufferIndex < *(int *)&(this->super_BeagleImpl).field_0xc)
     ) {
    ppfVar6 = this->gPartials;
    if (ppfVar6[(uint)bufferIndex] == (float *)0x0) {
      pfVar17 = (float *)malloc((long)this->kPartialsSize << 2);
      ppfVar6[(uint)bufferIndex] = pfVar17;
      if (this->gPartials[(uint)bufferIndex] == (float *)0x0) {
        return -2;
      }
    }
    iVar16 = this->kCategoryCount;
    if (0 < iVar16) {
      pfVar17 = this->gPartials[(uint)bufferIndex];
      iVar3 = this->kPatternCount;
      uVar4 = this->kStateCount;
      lVar20 = (long)(int)uVar4;
      iVar5 = this->kPartialsPaddedStateCount;
      uVar19 = (this->kPaddedPatternCount - iVar3) * iVar5;
      auVar25 = vpbroadcastq_avx512f();
      iVar23 = 0;
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar2 = vmovdqu64_avx512f(auVar25);
      do {
        if (0 < iVar3) {
          iVar22 = 0;
          pfVar21 = pfVar17;
          do {
            if (uVar4 != 0) {
              uVar18 = 0;
              do {
                auVar27 = vpbroadcastq_avx512f();
                auVar27 = vporq_avx512f(auVar27,auVar26);
                uVar15 = vpcmpuq_avx512f(auVar27,auVar25,2);
                pdVar1 = inPartials + uVar18;
                auVar27._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * (long)pdVar1[1];
                auVar27._0_8_ = (ulong)((byte)uVar15 & 1) * (long)*pdVar1;
                auVar27._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * (long)pdVar1[2];
                auVar27._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * (long)pdVar1[3];
                auVar27._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * (long)pdVar1[4];
                auVar27._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * (long)pdVar1[5];
                auVar27._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * (long)pdVar1[6];
                auVar27._56_8_ = (uVar15 >> 7) * (long)pdVar1[7];
                auVar24 = vcvtpd2ps_avx512f(auVar27);
                pfVar17 = pfVar21 + uVar18;
                bVar7 = (bool)((byte)uVar15 & 1);
                bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
                bVar9 = (bool)((byte)(uVar15 >> 2) & 1);
                bVar10 = (bool)((byte)(uVar15 >> 3) & 1);
                bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
                bVar12 = (bool)((byte)(uVar15 >> 5) & 1);
                bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
                bVar14 = SUB81(uVar15 >> 7,0);
                *pfVar17 = (float)((uint)bVar7 * auVar24._0_4_ | (uint)!bVar7 * (int)*pfVar17);
                pfVar17[1] = (float)((uint)bVar8 * auVar24._4_4_ | (uint)!bVar8 * (int)pfVar17[1]);
                pfVar17[2] = (float)((uint)bVar9 * auVar24._8_4_ | (uint)!bVar9 * (int)pfVar17[2]);
                pfVar17[3] = (float)((uint)bVar10 * auVar24._12_4_ | (uint)!bVar10 * (int)pfVar17[3]
                                    );
                pfVar17[4] = (float)((uint)bVar11 * auVar24._16_4_ | (uint)!bVar11 * (int)pfVar17[4]
                                    );
                pfVar17[5] = (float)((uint)bVar12 * auVar24._20_4_ | (uint)!bVar12 * (int)pfVar17[5]
                                    );
                pfVar17[6] = (float)((uint)bVar13 * auVar24._24_4_ | (uint)!bVar13 * (int)pfVar17[6]
                                    );
                pfVar17[7] = (float)((uint)bVar14 * auVar24._28_4_ | (uint)!bVar14 * (int)pfVar17[7]
                                    );
                uVar18 = uVar18 + 8;
              } while (((ulong)uVar4 + 7 & 0xfffffffffffffff8) != uVar18);
            }
            pfVar17 = pfVar21 + lVar20;
            if ((int)uVar4 < iVar5) {
              memset(pfVar17,0,(ulong)(~uVar4 + iVar5) * 4 + 4);
              auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar25 = vmovdqu64_avx512f(auVar2);
              pfVar17 = pfVar21 + (ulong)(~uVar4 + iVar5) + lVar20 + 1;
            }
            inPartials = inPartials + lVar20;
            iVar22 = iVar22 + 1;
            pfVar21 = pfVar17;
          } while (iVar22 != iVar3);
        }
        if (0 < (int)uVar19) {
          memset(pfVar17,0,(ulong)uVar19 * 4);
          auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar25 = vmovdqu64_avx512f(auVar2);
          pfVar17 = pfVar17 + (ulong)(uVar19 - 1) + 1;
        }
        iVar23 = iVar23 + 1;
      } while (iVar23 != iVar16);
    }
    iVar16 = 0;
  }
  return iVar16;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setPartials(int bufferIndex,
                               const double* inPartials) {
    if (bufferIndex < 0 || bufferIndex >= kBufferCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gPartials[bufferIndex] == NULL) {
        gPartials[bufferIndex] = (REALTYPE*) malloc(sizeof(REALTYPE) * kPartialsSize);
        if (gPartials[bufferIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }

    const double* inPartialsOffset = inPartials;
    REALTYPE* tmpRealPartialsOffset = gPartials[bufferIndex];
    for (int l = 0; l < kCategoryCount; l++) {
        for (int i = 0; i < kPatternCount; i++) {
            beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
            tmpRealPartialsOffset += kStateCount;
            // Pad extra buffer with zeros
            for(int k = kStateCount; k < kPartialsPaddedStateCount; k++) {
                *tmpRealPartialsOffset++ = 0;
            }
            inPartialsOffset += kStateCount;
        }
        // Pad extra buffer with zeros
        for(int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
            *tmpRealPartialsOffset++ = 0;
        }
    }

    return BEAGLE_SUCCESS;
}